

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

word Ifd_ObjTruth(Ifd_Man_t *p,int iLit)

{
  uint in_EAX;
  int iVar1;
  word wVar2;
  ulong uStack_18;
  int Counter;
  
  wVar2 = (word)(uint)iLit;
  uStack_18 = (ulong)in_EAX;
  if (iLit != 0) {
    if (iLit == 1) {
      wVar2 = 0xffffffffffffffff;
    }
    else {
      iVar1 = Abc_LitRegular(iLit);
      wVar2 = Ifd_ObjTruth_rec(p,iVar1,&Counter);
      iVar1 = Abc_LitIsCompl(iLit);
      wVar2 = (long)-iVar1 ^ wVar2;
    }
  }
  return wVar2;
}

Assistant:

word Ifd_ObjTruth( Ifd_Man_t * p, int iLit )
{
    word Fun;
    int Counter = 0;
    if ( iLit == 0 )
        return 0;
    if ( iLit == 1 )
        return ~(word)0;
    Fun = Ifd_ObjTruth_rec( p, Abc_LitRegular(iLit), &Counter );
    return Abc_LitIsCompl(iLit) ? ~Fun : Fun;
}